

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O1

void makecorridors(level *lev,int style)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  schar *psVar10;
  uint uVar11;
  ulong uVar12;
  int *piVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  bool bVar21;
  long local_40;
  
  switch(style) {
  case 1:
    if ((1 < lev->nroom) && (0 < lev->nroom)) {
      uVar17 = 0;
      iVar18 = 0;
      do {
        iVar14 = 100;
        if (100 < iVar18) {
          iVar14 = iVar18;
        }
        do {
          iVar15 = lev->nroom;
          uVar6 = mt_random();
          uVar12 = SUB168(ZEXT416(uVar6) % SEXT816((long)iVar15 + -1),0);
          if ((uVar17 != uVar12) && (iVar15 = iVar18, lev->rooms[uVar12].doorct == '\0')) break;
          iVar18 = iVar18 + 1;
          iVar15 = iVar14 + 1;
        } while (iVar14 + 1 != iVar18);
        iVar18 = iVar15;
        if (99 < iVar18) {
          uVar12 = 0;
          if (1 < lev->nroom) {
            uVar6 = lev->nroom - 1;
            uVar12 = 0;
            psVar10 = &lev->rooms[0].doorct;
            do {
              if ((uVar17 != uVar12) && (*psVar10 == '\0')) goto LAB_001d6304;
              uVar12 = uVar12 + 1;
              psVar10 = psVar10 + 0xd8;
            } while (uVar6 != uVar12);
            uVar12 = (ulong)uVar6;
          }
        }
LAB_001d6304:
        join(lev,(int)uVar17,(uint)(uVar17 == (uVar12 & 0xffffffff)) + (int)uVar12,'\0');
        uVar17 = uVar17 + 1;
      } while ((long)uVar17 < (long)lev->nroom);
    }
    break;
  case 2:
    iVar18 = lev->nroom;
    if (0 < iVar18) {
      iVar14 = 0;
      do {
        iVar15 = iVar14 + 1;
        join(lev,iVar14,iVar15 % iVar18,'\0');
        iVar18 = lev->nroom;
        iVar14 = iVar15;
      } while (iVar15 < iVar18);
    }
    break;
  case 3:
    if (1 < (long)lev->nroom) {
      psVar10 = &lev->rooms[0].hy;
      iVar18 = 9999;
      uVar17 = 0;
      uVar12 = 0;
      do {
        iVar15 = (int)((mkroom *)(psVar10 + -3))->lx +
                 ((int)psVar10[-2] - (int)((mkroom *)(psVar10 + -3))->lx) / 2 + -0x28;
        iVar14 = -iVar15;
        if (0 < iVar15) {
          iVar14 = iVar15;
        }
        iVar9 = (int)psVar10[-1] + ((int)*psVar10 - (int)psVar10[-1]) / 2 + -10;
        iVar15 = -iVar9;
        if (0 < iVar9) {
          iVar15 = iVar9;
        }
        if (iVar15 + iVar14 < iVar18) {
          uVar12 = uVar17 & 0xffffffff;
          iVar18 = iVar15 + iVar14;
        }
        uVar17 = uVar17 + 1;
        psVar10 = psVar10 + 0xd8;
      } while ((long)lev->nroom != uVar17);
      iVar14 = (int)uVar12;
      iVar18 = iVar14;
      if (0 < iVar14) {
        iVar15 = 0;
        do {
          join(lev,iVar15,iVar14,'\0');
          iVar15 = iVar15 + 1;
        } while (iVar14 != iVar15);
      }
      while (iVar18 = iVar18 + 1, iVar18 < lev->nroom) {
        join(lev,iVar18,iVar14,'\0');
      }
    }
    break;
  case 4:
    bVar21 = lev->rooms[0].lx == lev->rooms[2].lx;
    uVar6 = (uint)bVar21;
    uVar7 = uVar6 + 2;
    if ((int)uVar7 < lev->nroom) {
      iVar18 = 0;
      do {
        uVar4 = mt_random();
        uVar17 = (ulong)uVar4 % (ulong)uVar7;
        iVar14 = (int)uVar17 + iVar18;
        join(lev,iVar14,iVar14 + uVar7,'\0');
        iVar14 = uVar6 + 1;
        do {
          uVar4 = mt_random();
          if ((uVar4 & 3) == 0) {
            uVar17 = (ulong)((int)uVar17 + 1) % (ulong)uVar7;
            iVar15 = (int)uVar17 + iVar18;
            join(lev,iVar15,iVar15 + uVar7,'\0');
          }
          iVar14 = iVar14 + -1;
        } while (iVar14 != 0);
        iVar18 = iVar18 + uVar7;
      } while (iVar18 < (int)(lev->nroom - uVar7));
    }
    local_40 = 0x31cb94;
    uVar17 = 0;
    do {
      iVar18 = lev->nroom;
      uVar4 = mt_random();
      auVar2 = ZEXT416(uVar4) % SEXT816((long)(iVar18 / (int)uVar7));
      uVar12 = auVar2._0_8_;
      iVar14 = uVar7 * auVar2._0_4_;
      iVar18 = (int)uVar17;
      join(lev,iVar14 + iVar18,iVar14 + iVar18 + 1,'\0');
      if (1 < lev->nroom / (int)uVar7) {
        iVar14 = 1;
        do {
          uVar4 = mt_random();
          if ((uVar4 & 3) == 0) {
            iVar15 = lev->nroom;
            uVar4 = mt_random();
            iVar9 = lev->nroom / (int)uVar7;
            uVar12 = (long)((int)uVar12 +
                           SUB164(ZEXT416(uVar4) % SEXT816((long)(iVar15 / (int)uVar7 - iVar14)),0))
                     % (long)iVar9;
            uVar4 = (uint)uVar12;
            uVar16 = uVar12 & 0xffffffff;
            uVar8 = (ulong)(uVar4 * uVar7 + iVar18);
            if (smeq[uVar8] == smeq[uVar8 + 1]) {
              uVar5 = (lev->nroom * 2) / (int)uVar7;
              uVar11 = uVar4;
              if ((int)uVar4 <= (int)uVar5) {
                uVar11 = uVar5;
              }
              lVar20 = ((uVar12 & 0xffffffff) + 1) * (ulong)(uVar7 * 4);
              lVar19 = local_40;
              do {
                uVar4 = uVar11;
                if ((int)uVar5 <= (int)uVar16) break;
                lVar1 = lVar19 + -4;
                uVar4 = (int)uVar16 + 1;
                uVar16 = (ulong)uVar4;
                piVar13 = (int *)(lVar19 + lVar20);
                lVar19 = lVar19 + (ulong)(uVar7 * 4);
              } while (*(int *)(lVar1 + lVar20) == *piVar13);
            }
            uVar8 = (long)(int)uVar4 % (long)iVar9;
            uVar12 = uVar8 & 0xffffffff;
            iVar15 = (int)uVar8 * uVar7;
            join(lev,iVar15 + iVar18,iVar15 + iVar18 + 1,'\0');
          }
          iVar14 = iVar14 + 1;
        } while (iVar14 < lev->nroom / (int)uVar7);
      }
      uVar17 = uVar17 + 1;
      local_40 = local_40 + 4;
    } while (uVar17 != uVar6 + 1);
    if (0 < lev->nroom) {
      uVar17 = 0;
      do {
        iVar18 = smeq[uVar17];
        iVar14 = smeq[iVar18];
        if (iVar14 < iVar18) {
          piVar13 = smeq + uVar17;
          do {
            *piVar13 = iVar14;
            piVar13 = smeq + iVar14;
            iVar18 = *piVar13;
            iVar14 = smeq[iVar18];
          } while (iVar14 < iVar18);
        }
        if (iVar18 != 0) {
          join(lev,(int)uVar17,
               (-(uint)((int)((uVar17 & 0xffffffff) % (ulong)uVar7) != 0) | -(uint)bVar21 - 2) +
               (int)uVar17,'\0');
        }
        uVar17 = uVar17 + 1;
      } while ((long)uVar17 < (long)lev->nroom);
    }
    break;
  default:
    iVar18 = 1;
    do {
      if (lev->nroom + -1 <= iVar18 + -1) break;
      join(lev,iVar18 + -1,iVar18,'\0');
      uVar6 = mt_random();
      iVar18 = iVar18 + 1;
    } while (0x51eb851 < (uVar6 * -0x3d70a3d7 >> 1 | (uint)((uVar6 * -0x3d70a3d7 & 1) != 0) << 0x1f)
            );
    if (2 < lev->nroom) {
      lVar19 = 0;
      do {
        if (smeq[lVar19] != smeq[lVar19 + 2]) {
          join(lev,(int)lVar19,(int)lVar19 + 2,'\0');
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 < (long)lev->nroom + -2);
    }
    lVar19 = 0;
    do {
      if (lev->nroom <= lVar19) break;
      if (lev->nroom < 1) {
        bVar21 = true;
      }
      else {
        lVar20 = 0;
        bVar21 = false;
        do {
          if (smeq[lVar19] != smeq[lVar20]) {
            join(lev,(int)lVar19,(int)lVar20,'\0');
            bVar21 = true;
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 < lev->nroom);
        bVar21 = !bVar21;
      }
      lVar19 = lVar19 + 1;
    } while (!bVar21);
    uVar6 = lev->nroom;
    if (2 < (int)uVar6) {
      uVar7 = mt_random();
      iVar18 = uVar7 % uVar6 + 4;
      do {
        iVar14 = lev->nroom;
        uVar6 = mt_random();
        auVar2 = ZEXT416(uVar6) % SEXT816((long)iVar14);
        iVar14 = lev->nroom;
        uVar6 = mt_random();
        auVar3 = ZEXT416(uVar6) % SEXT816((long)iVar14 + -2);
        iVar14 = auVar3._0_4_;
        iVar15 = iVar14 + 2;
        if (auVar3._0_8_ < auVar2._0_8_) {
          iVar15 = iVar14;
        }
        join(lev,auVar2._0_4_,iVar15,'\x01');
        iVar18 = iVar18 + -1;
      } while (iVar18 != 0);
    }
  }
  return;
}

Assistant:

void makecorridors(struct level *lev, int style)
{
	int a, b, i;
	boolean any = TRUE;

	switch (style) {
	case LEVSTYLE_STANDARD:
	default: /* vanilla style */
	    for (a = 0; a < lev->nroom - 1; a++) {
		join(lev, a, a + 1, FALSE);
		if (!rn2(50))
		    break; /* allow some randomness */
	    }
	    for (a = 0; a < lev->nroom - 2; a++) {
		if (smeq[a] != smeq[a + 2])
		    join(lev, a, a + 2, FALSE);
	    }
	    for (a = 0; any && a < lev->nroom; a++) {
		any = FALSE;
		for (b = 0; b < lev->nroom; b++) {
		    if (smeq[a] != smeq[b]) {
			join(lev, a, b, FALSE);
			any = TRUE;
		    }
		}
	    }
	    if (lev->nroom > 2) {
		for (i = rn2(lev->nroom) + 4; i; i--) {
		    a = rn2(lev->nroom);
		    b = rn2(lev->nroom - 2);
		    if (b >= a)
			b += 2;
		    join(lev, a, b, TRUE);
		}
	    }
	    break;

	case LEVSTYLE_ANYTOANY: /* at least one corridor leaves from each room
				 * and goes to a random room */
	    if (lev->nroom > 1) {
		int cnt = 0;
		for (a = 0; a < lev->nroom; a++) {
		    do {
			b = rn2(lev->nroom - 1);
		    } while ((a == b || lev->rooms[b].doorct) && cnt++ < 100);
		    if (cnt >= 100) {
			for (b = 0; b < lev->nroom - 1; b++) {
			    if (!lev->rooms[b].doorct && a != b)
				break;
			}
		    }
		    if (a == b)
			b++;
		    join(lev, a, b, FALSE);
		}
	    }
	    break;

	case LEVSTYLE_RING: /* circular path:
			     * room1 -> room2 -> room3 -> ... -> room1 */
	    for (a = 0; a < lev->nroom; a++) {
		b = (a + 1) % lev->nroom;
		join(lev, a, b, FALSE);
	    }
	    break;

	case LEVSTYLE_HUB: /* all roads lead to rome... or to the first room */
	    if (lev->nroom > 1) {
		/* find the most central room Manhattan-style */
		int mindist = 9999; /* arbitrary big number */
		b = 0;
		for (i = 0; i < lev->nroom; i++) {
		    struct mkroom *r = &lev->rooms[i];
		    int cx = abs(r->lx + (r->hx - r->lx) / 2 - COLNO / 2);
		    int cy = abs(r->ly + (r->hy - r->ly) / 2 - ROWNO / 2);
		    if (cx + cy < mindist) {
			b = i;
			mindist = cx + cy;
		    }
		}

		for (a = 0; a < b; a++)
		    join(lev, a, b, FALSE);
		for (a = b + 1; a < lev->nroom; a++)
		    join(lev, a, b, FALSE);
	    }
	    break;

	case LEVSTYLE_GRID: /* rooms should be in column-major order */
	    {
		/* First, we need to establish whether the grid height is 2 or 3. */
		int grid_height = (lev->rooms[0].lx == lev->rooms[2].lx) ? 3 : 2;
		int r;

		/* Make random horizontal joins, at least one per column. */
		for (a = 0; a < lev->nroom - grid_height; a += grid_height) {
		    r = rn2(grid_height);
		    join(lev, a + r, a + r + grid_height, FALSE);

		    for (b = 1; b < grid_height; b++) {
			if (!rn2(4)) {
			    r = (r + 1) % grid_height;
			    join(lev, a + r, a + r + grid_height, FALSE);
			}
		    }
		}

		/* Make vertical joins, at least one per row. */
		for (b = 0; b < grid_height - 1; b++) {
		    r = rn2(lev->nroom / grid_height);
		    join(lev, b+grid_height*r, b+grid_height*r+1, FALSE);

		    for (a = 1; a < lev->nroom / grid_height; a++) {
			if (!rn2(4)) {
			    /* Pick a random column. */
			    r = (r + rn2(lev->nroom / grid_height - a)) %
				(lev->nroom / grid_height);
			    /* Move along to one that isn't already joined. */
			    while (smeq[b+grid_height*r] == smeq[b+grid_height*r+1] &&
				   r < 2 * lev->nroom / grid_height) {
				r++;
			    }
			    r %= lev->nroom / grid_height;
			    /* Join it. */
			    join(lev, b+grid_height*r, b+grid_height*r+1, FALSE);
			}
		    }
		}

		/* Finally, just make sure that all rooms are connected. */
		for (a = 0; a < lev->nroom; a++) {
		    b = a;
		    while (smeq[b] > smeq[smeq[b]]) {
			smeq[b] = smeq[smeq[b]]; /* Just to speed up later checks. */
			b = smeq[b];
		    }
		    if (smeq[b] != 0) {
			/*
			 * Well, we know that the rooms before this one are connected
			 * to room 0...
			 */
			if (a % grid_height == 0) {
			    join(lev, a, a - grid_height, FALSE);
			} else {
			    join(lev, a, a - 1, FALSE);
			}
		    }
		}
	    }
	    break;
	}
}